

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void compareReset(ResetPtr *r1,ResetPtr *r2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  char cVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  shared_ptr<libcellml::Variable> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  libcellml::Entity::id_abi_cxx11_();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_a0,"r1->id()","r2->id()",&local_70,&local_90);
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_a0.
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x197,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._M_dataplus._M_p._0_4_ = libcellml::Reset::order();
  local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       libcellml::Reset::order();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_70,"r1->order()","r2->order()",(int *)&local_90,(int *)&local_a0);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x198,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_90._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
      }
      local_90._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Reset::variable();
  _Var3._M_p = local_70._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
  }
  if ((long *)_Var3._M_p != (long *)0x0) {
    libcellml::Reset::variable();
    libcellml::Reset::variable();
    testing::internal::
    CmpHelperNE<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
              ((internal *)&local_70,"r1->variable()","r2->variable()",
               (shared_ptr<libcellml::Variable> *)&local_90,&local_a0);
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
    }
    if ((char)local_70._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)(undefined1 *)local_70._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x19a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && ((long *)local_90._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
        }
        local_90._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    libcellml::Reset::variable();
    libcellml::NamedEntity::name_abi_cxx11_();
    libcellml::Reset::variable();
    libcellml::NamedEntity::name_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_a0,"r1->variable()->name()","r2->variable()->name()",&local_70,
               &local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
        (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_a0.
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x19b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
        local_70._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  libcellml::Reset::testVariable();
  _Var3._M_p = local_70._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
  }
  if ((long *)_Var3._M_p != (long *)0x0) {
    libcellml::Reset::testVariable();
    libcellml::Reset::testVariable();
    testing::internal::
    CmpHelperNE<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
              ((internal *)&local_70,"r1->testVariable()","r2->testVariable()",
               (shared_ptr<libcellml::Variable> *)&local_90,&local_a0);
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
    }
    if ((char)local_70._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)(undefined1 *)local_70._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x19e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && ((long *)local_90._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
        }
        local_90._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    libcellml::Reset::testVariable();
    libcellml::NamedEntity::name_abi_cxx11_();
    libcellml::Reset::testVariable();
    libcellml::NamedEntity::name_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_a0,"r1->testVariable()->name()","r2->testVariable()->name()",
               &local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
        (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_a0.
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x19f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
        local_70._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  libcellml::Reset::testValueId_abi_cxx11_();
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_a0,"r1->testValueId()","r2->testValueId()",&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_a0.
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x1a1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Reset::resetValueId_abi_cxx11_();
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_a0,"r1->resetValueId()","r2->resetValueId()",&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_a0.
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x1a2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void compareReset(const libcellml::ResetPtr &r1, const libcellml::ResetPtr &r2)
{
    EXPECT_EQ(r1->id(), r2->id());
    EXPECT_EQ(r1->order(), r2->order());
    if (r1->variable() != nullptr) {
        EXPECT_NE(r1->variable(), r2->variable());
        EXPECT_EQ(r1->variable()->name(), r2->variable()->name());
    }
    if (r1->testVariable() != nullptr) {
        EXPECT_NE(r1->testVariable(), r2->testVariable());
        EXPECT_EQ(r1->testVariable()->name(), r2->testVariable()->name());
    }
    EXPECT_EQ(r1->testValueId(), r2->testValueId());
    EXPECT_EQ(r1->resetValueId(), r2->resetValueId());
}